

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange
          (DescriptorProto_ExtensionRange *this,DescriptorProto_ExtensionRange *from)

{
  bool bVar1;
  void *pvVar2;
  ExtensionRangeOptions *in_RSI;
  undefined8 *in_RDI;
  Arena *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  ExtensionRangeOptions *in_stack_ffffffffffffffa8;
  DescriptorProto_ExtensionRange *this_00;
  
  Message::Message((Message *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  *in_RDI = &PTR__DescriptorProto_ExtensionRange_008da430;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
            );
  *(undefined4 *)(in_RDI + 2) = *(undefined4 *)&(in_RSI->_extensions_).flat_capacity_;
  internal::CachedSize::CachedSize((CachedSize *)0x4f266c);
  this_00 = (DescriptorProto_ExtensionRange *)&in_RSI->_extensions_;
  if (((uint)((ExtensionSet *)this_00)->arena_ & 1) == 1) {
    if (((uint)((ExtensionSet *)this_00)->arena_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)
               CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               (UnknownFieldSet *)in_stack_ffffffffffffff58);
  }
  bVar1 = _internal_has_options(this_00);
  if (bVar1) {
    pvVar2 = operator_new(0x48);
    ExtensionRangeOptions::ExtensionRangeOptions(in_RSI,in_stack_ffffffffffffffa8);
    in_RDI[3] = pvVar2;
  }
  else {
    in_RDI[3] = 0;
  }
  memcpy(in_RDI + 4,&in_RSI->_internal_metadata_,8);
  return;
}

Assistant:

DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange(const DescriptorProto_ExtensionRange& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from._internal_has_options()) {
    options_ = new PROTOBUF_NAMESPACE_ID::ExtensionRangeOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  ::memcpy(&start_, &from.start_,
    static_cast<size_t>(reinterpret_cast<char*>(&end_) -
    reinterpret_cast<char*>(&start_)) + sizeof(end_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.DescriptorProto.ExtensionRange)
}